

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmevent.c
# Opt level: O1

ptrdiff_t lj_vmevent_prepare(lua_State *L,VMEvent ev)

{
  byte *pbVar1;
  uint uVar2;
  TValue *pTVar3;
  bool bVar4;
  GCstr *pGVar5;
  cTValue *pcVar6;
  ulong uVar7;
  uint *puVar8;
  VMEvent key;
  GCtab *t;
  cTValue *pcVar9;
  
  uVar2 = (L->glref).ptr32;
  pGVar5 = lj_str_new(L,"_VMEVENTS",9);
  uVar7 = (ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x98);
  puVar8 = (uint *)((ulong)*(uint *)(uVar7 + 0x14) +
                   (ulong)(*(uint *)(uVar7 + 0x1c) & pGVar5->hash) * 0x18);
  do {
    if ((puVar8[3] == 0xfffffffb) && (pGVar5 == (GCstr *)(ulong)puVar8[2])) goto LAB_0011222b;
    puVar8 = (uint *)(ulong)puVar8[4];
  } while (puVar8 != (uint *)0x0);
  puVar8 = (uint *)0x0;
LAB_0011222b:
  if (puVar8[1] == 0xfffffff4) {
    key = ev & 0xfffffff8;
    t = (GCtab *)(ulong)*puVar8;
    if (key < t->asize) {
      pcVar6 = (cTValue *)(ulong)(t->array).ptr32;
      pcVar9 = pcVar6 + (int)key;
    }
    else {
      pcVar6 = lj_tab_getinth(t,key);
      pcVar9 = pcVar6;
    }
    bVar4 = true;
    if ((pcVar9 != (cTValue *)0x0) && ((pcVar9->field_2).it == 0xfffffff7)) {
      if ((long)((ulong)(L->maxstack).ptr32 - (long)L->top) < 0xa1) {
        lj_state_growstack(L,0x14);
      }
      pTVar3 = L->top;
      L->top = pTVar3 + 1;
      (pTVar3->field_2).field_0 = (pcVar9->field_2).field_0;
      (pTVar3->field_2).it = 0xfffffff7;
      pcVar6 = (cTValue *)((long)L->top - (ulong)(L->stack).ptr32);
      bVar4 = false;
    }
    if (!bVar4) {
      return (ptrdiff_t)pcVar6;
    }
  }
  pbVar1 = (byte *)((ulong)uVar2 + 0x93);
  *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)ev & 7));
  return 0;
}

Assistant:

ptrdiff_t lj_vmevent_prepare(lua_State *L, VMEvent ev)
{
  global_State *g = G(L);
  GCstr *s = lj_str_newlit(L, LJ_VMEVENTS_REGKEY);
  cTValue *tv = lj_tab_getstr(tabV(registry(L)), s);
  if (tvistab(tv)) {
    int hash = VMEVENT_HASH(ev);
    tv = lj_tab_getint(tabV(tv), hash);
    if (tv && tvisfunc(tv)) {
      lj_state_checkstack(L, LUA_MINSTACK);
      setfuncV(L, L->top++, funcV(tv));
      return savestack(L, L->top);
    }
  }
  g->vmevmask &= ~VMEVENT_MASK(ev);  /* No handler: cache this fact. */
  return 0;
}